

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaCompressorSimd.cpp
# Opt level: O0

void testDwaCompressorSimd(string *param_1)

{
  ostream *poVar1;
  exception *e;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"SIMD helper functions for DwaCompressor:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_e2799::testCsc();
  anon_unknown.dwarf_e2799::testInterleave();
  anon_unknown.dwarf_e2799::testFloatToHalf();
  anon_unknown.dwarf_e2799::testFromHalfZigZag();
  anon_unknown.dwarf_e2799::testDct();
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void 
testDwaCompressorSimd (const string&)
{
    cout << "SIMD helper functions for DwaCompressor:" << endl;

    try
    {
    
        testCsc();
        testInterleave();
        testFloatToHalf();
        testFromHalfZigZag();

        testDct();

    }
    catch (const exception &e)
    {
        cout << "unexpected exception: " << e.what() << endl;
        assert (false);
    }
    catch (...)
    {
        cout << "unexpected exception" << endl;
        assert (false);
    }

    cout << "ok\n" << endl;
}